

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

char * fmt::v5::internal::
       parse_arg_id<char,fmt::v5::internal::id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>>>,char,fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>>,char>>&,char>>
                 (char *begin,char *end,
                 id_adapter<fmt::v5::format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_&,_char>
                 *handler)

{
  byte bVar1;
  format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
  *pfVar2;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  uint id;
  basic_string_view<char> name;
  anon_union_16_11_26d04ec8_for_value<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>_1
  local_48;
  type local_38;
  
  bVar1 = *begin;
  if ((bVar1 == 0x7d) || (bVar1 == 0x3a)) {
    pfVar2 = handler->handler;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    next_arg((format_arg *)&local_48.string,&pfVar2->context);
    (pfVar2->arg).type_ = local_38;
    (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
    pbVar5 = (byte *)begin;
  }
  else if ((byte)(bVar1 - 0x30) < 10) {
    pbVar5 = (byte *)(begin + 1);
    id = 0;
    pbVar4 = pbVar5;
    if (bVar1 != 0x30) {
      do {
        if (0xccccccc < id) goto LAB_001158ab;
        id = ((uint)bVar1 + id * 10) - 0x30;
        pbVar5 = (byte *)end;
        if (pbVar4 == (byte *)end) break;
        bVar1 = *pbVar4;
        pbVar5 = pbVar4;
        pbVar4 = pbVar4 + 1;
      } while ((byte)(bVar1 - 0x30) < 10);
      if ((int)id < 0) {
LAB_001158ab:
        error_handler::on_error((error_handler *)handler->handler,"number is too big");
      }
    }
    if ((pbVar5 == (byte *)end) || ((*pbVar5 != 0x3a && (*pbVar5 != 0x7d)))) {
LAB_001158d9:
      error_handler::on_error((error_handler *)handler->handler,"invalid format string");
    }
    format_handler<fmt::v5::arg_formatter<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<char>_>_>,_char,_fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>_>
    ::on_arg_id(handler->handler,id);
  }
  else {
    if ((bVar1 != 0x5f) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) goto LAB_001158d9;
    pbVar4 = (byte *)(begin + 1);
    do {
      pbVar3 = pbVar4;
      pbVar5 = (byte *)end;
      if (pbVar3 == (byte *)end) break;
      bVar1 = *pbVar3;
      pbVar4 = pbVar3 + 1;
    } while ((((byte)(bVar1 - 0x30) < 10) || (bVar1 == 0x5f)) ||
            (pbVar5 = pbVar3, (byte)((bVar1 & 0xdf) + 0xbf) < 0x1a));
    name.size_ = (long)pbVar5 - (long)begin;
    pfVar2 = handler->handler;
    name.data_ = begin;
    basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<char>_>,_char>::
    get_arg((format_arg *)&local_48.string,&pfVar2->context,name);
    (pfVar2->arg).type_ = local_38;
    (pfVar2->arg).value_.field_0.long_long_value = local_48.long_long_value;
    (pfVar2->arg).value_.field_0.string.size = local_48.string.size;
  }
  return (char *)pbVar5;
}

Assistant:

FMT_CONSTEXPR const Char *parse_arg_id(
    const Char *begin, const Char *end, IDHandler &&handler) {
  assert(begin != end);
  Char c = *begin;
  if (c == '}' || c == ':')
    return handler(), begin;
  if (c >= '0' && c <= '9') {
    unsigned index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      return handler.on_error("invalid format string"), begin;
    handler(index);
    return begin;
  }
  if (!is_name_start(c))
    return handler.on_error("invalid format string"), begin;
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}